

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O3

PluralRules * __thiscall
icu_63::number::impl::NumberFormatterImpl::resolvePluralRules
          (NumberFormatterImpl *this,PluralRules *rulesPtr,Locale *locale,UErrorCode *status)

{
  PluralRules *pPVar1;
  
  if ((rulesPtr == (PluralRules *)0x0) &&
     (rulesPtr = (this->fRules).super_LocalPointerBase<const_icu_63::PluralRules>.ptr,
     rulesPtr == (PluralRules *)0x0)) {
    rulesPtr = PluralRules::forLocale(locale,status);
    pPVar1 = (this->fRules).super_LocalPointerBase<const_icu_63::PluralRules>.ptr;
    if (pPVar1 != (PluralRules *)0x0) {
      (*(pPVar1->super_UObject)._vptr_UObject[1])();
    }
    (this->fRules).super_LocalPointerBase<const_icu_63::PluralRules>.ptr = rulesPtr;
  }
  return rulesPtr;
}

Assistant:

const PluralRules*
NumberFormatterImpl::resolvePluralRules(const PluralRules* rulesPtr, const Locale& locale,
                                        UErrorCode& status) {
    if (rulesPtr != nullptr) {
        return rulesPtr;
    }
    // Lazily create PluralRules
    if (fRules.isNull()) {
        fRules.adoptInstead(PluralRules::forLocale(locale, status));
    }
    return fRules.getAlias();
}